

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c++
# Opt level: O1

int kj::runMainAndExit(ProcessContext *context,MainFunc *func,int argc,char **argv)

{
  char *__s;
  ProcessContext *pPVar1;
  long lVar2;
  ulong uVar3;
  size_t sVar4;
  StringPtr *ptrCopy;
  Exception *pEVar5;
  ArrayPtr<kj::StringPtr> params;
  Fault f;
  StringPtr params_stack [8];
  NullableValue<kj::Exception> exception;
  char **local_3c8;
  Exception *local_3c0;
  undefined8 *local_3b8;
  ProcessContext *local_3b0;
  Exception *local_3a8;
  Exception *local_3a0;
  Maybe<kj::Exception> local_398;
  Runnable local_238;
  MainFunc *local_230;
  char ***local_228;
  Exception **local_220;
  undefined1 local_218 [128];
  void *local_198;
  undefined1 auStack_190 [40];
  char *local_168;
  void *pvStack_160;
  ArrayDisposer *local_158;
  Disposer *pDStack_150;
  Context *local_148;
  undefined1 local_140 [272];
  
  local_3c8 = argv;
  if (0 < argc) {
    local_3a0 = (Exception *)(ulong)(argc - 1);
    lVar2 = 0;
    do {
      *(char **)(local_218 + lVar2) = "";
      *(undefined8 *)(local_218 + lVar2 + 8) = 1;
      lVar2 = lVar2 + 0x10;
    } while (lVar2 != 0x80);
    local_3b8 = (undefined8 *)0x0;
    pEVar5 = (Exception *)0x0;
    local_3c0 = (Exception *)0x0;
    if (9 < (uint)argc) {
      pEVar5 = (Exception *)
               _::HeapArrayDisposer::allocateImpl
                         (0x10,(size_t)local_3a0,(size_t)local_3a0,
                          _::HeapArrayDisposer::Allocate_<kj::StringPtr,_false,_false>::construct,
                          _::HeapArrayDisposer::Allocate_<kj::StringPtr,_false,_false>::destruct);
      local_3b8 = &_::HeapArrayDisposer::instance;
      local_3c0 = local_3a0;
    }
    local_3a8 = (Exception *)local_218;
    if (9 < (uint)argc) {
      local_3a0 = local_3c0;
      local_3a8 = pEVar5;
    }
    pEVar5 = local_3c0;
    local_3b0 = context;
    if (argc != 1) {
      uVar3 = 2;
      if (2 < argc) {
        uVar3 = (ulong)(uint)argc;
      }
      lVar2 = 0;
      do {
        __s = *(char **)((long)local_3c8 + lVar2 + 8);
        sVar4 = strlen(__s);
        *(char **)((long)local_3a8->trace + lVar2 * 2 + -0x50) = __s;
        *(size_t *)((long)local_3a8->trace + lVar2 * 2 + -0x48) = sVar4 + 1;
        lVar2 = lVar2 + 8;
        pEVar5 = local_3a8;
      } while (uVar3 * 8 + -8 != lVar2);
    }
    local_238._vptr_Runnable = (_func_int **)&PTR_run_0046b590;
    local_228 = &local_3c8;
    local_220 = &local_3a8;
    local_230 = func;
    _::runCatchingExceptions(&local_398,&local_238);
    local_198 = (void *)CONCAT71(local_198._1_7_,local_398.ptr.isSet);
    if (local_398.ptr.isSet == true) {
      auStack_190._0_8_ = local_398.ptr.field_1.value.ownFile.content.ptr;
      auStack_190._8_8_ = local_398.ptr.field_1.value.ownFile.content.size_;
      auStack_190._16_8_ = local_398.ptr.field_1.value.ownFile.content.disposer;
      local_398.ptr.field_1.value.ownFile.content.ptr = (char *)0x0;
      local_398.ptr.field_1.value.ownFile.content.size_ = 0;
      auStack_190._24_8_ = local_398.ptr.field_1.value.file;
      auStack_190._32_8_ = local_398.ptr.field_1._32_8_;
      local_168 = local_398.ptr.field_1.value.description.content.ptr;
      pvStack_160 = (void *)local_398.ptr.field_1.value.description.content.size_;
      local_158 = local_398.ptr.field_1.value.description.content.disposer;
      pDStack_150 = local_398.ptr.field_1.value.context.ptr.disposer;
      local_398.ptr.field_1.value.description.content.ptr = (char *)0x0;
      local_398.ptr.field_1.value.description.content.size_ = 0;
      local_148 = local_398.ptr.field_1.value.context.ptr.ptr;
      local_398.ptr.field_1.value.context.ptr.ptr = (Context *)0x0;
      memcpy(local_140,(undefined1 *)((long)&local_398.ptr.field_1.value + 0x50),0x104);
      Exception::~Exception((Exception *)&local_398.ptr.field_1);
    }
    pPVar1 = local_3b0;
    if ((char)local_198 == '\x01') {
      str<char_const(&)[28],kj::Exception&>
                ((String *)&local_398,(kj *)"*** Uncaught exception ***\n",
                 (char (*) [28])auStack_190,pEVar5);
      pEVar5 = (Exception *)0x385fb3;
      if (local_398.ptr.field_1.value.ownFile.content.ptr != (char *)0x0) {
        pEVar5 = (Exception *)local_398.ptr._0_8_;
      }
      (*pPVar1->_vptr_ProcessContext[3])
                (pPVar1,pEVar5,
                 local_398.ptr.field_1.value.ownFile.content.ptr +
                 (local_398.ptr.field_1.value.ownFile.content.ptr == (char *)0x0));
      String::~String((String *)&local_398);
    }
    if ((char)local_198 == '\x01') {
      Exception::~Exception((Exception *)auStack_190);
    }
    (*pPVar1->_vptr_ProcessContext[1])(pPVar1);
  }
  local_398.ptr._0_8_ = (Exception *)0x0;
  local_198 = (void *)0x0;
  auStack_190._0_8_ = (char *)0x0;
  _::Debug::Fault::init
            ((Fault *)&local_398,
             (EVP_PKEY_CTX *)
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/main.c++"
            );
  _::Debug::Fault::fatal((Fault *)&local_398);
}

Assistant:

int runMainAndExit(ProcessContext& context, MainFunc&& func, int argc, char* argv[]) {
  setStandardIoMode(STDIN_FILENO);
  setStandardIoMode(STDOUT_FILENO);
  setStandardIoMode(STDERR_FILENO);

#if !KJ_NO_EXCEPTIONS
  try {
#endif
    KJ_ASSERT(argc > 0);

    KJ_STACK_ARRAY(StringPtr, params, argc - 1, 8, 32);
    for (int i = 1; i < argc; i++) {
      params[i - 1] = argv[i];
    }

    KJ_IF_MAYBE(exception, runCatchingExceptions([&]() {
      func(argv[0], params);
    })) {
      context.error(str("*** Uncaught exception ***\n", *exception));
    }
    context.exit();
#if !KJ_NO_EXCEPTIONS
  } catch (const TopLevelProcessContext::CleanShutdownException& e) {
    return e.exitCode;
  }
#endif
  KJ_CLANG_KNOWS_THIS_IS_UNREACHABLE_BUT_GCC_DOESNT
}